

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O0

void __thiscall
cmFindLibraryHelper::DebugLibraryFound(cmFindLibraryHelper *this,string *name,string *path)

{
  undefined8 path_00;
  string local_c0;
  cmAlphaNum local_a0;
  cmAlphaNum local_70;
  undefined1 local_40 [8];
  string regexName;
  string *path_local;
  string *name_local;
  cmFindLibraryHelper *this_local;
  
  if ((this->DebugMode & 1U) != 0) {
    regexName.field_2._8_8_ = path;
    cmAlphaNum::cmAlphaNum(&local_70,&this->PrefixRegexStr);
    cmAlphaNum::cmAlphaNum(&local_a0,name);
    cmStrCat<std::__cxx11::string>((string *)local_40,&local_70,&local_a0,&this->SuffixRegexStr);
    path_00 = regexName.field_2._8_8_;
    std::__cxx11::string::string((string *)&local_c0,(string *)local_40);
    cmFindBaseDebugState::FoundAt(&this->DebugSearches,(string *)path_00,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)local_40);
  }
  return;
}

Assistant:

void DebugLibraryFound(std::string const& name, std::string const& path)
  {
    if (this->DebugMode) {
      auto regexName =
        cmStrCat(this->PrefixRegexStr, name, this->SuffixRegexStr);
      this->DebugSearches.FoundAt(path, regexName);
    }
  }